

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_squares_avx2.c
# Opt level: O1

uint64_t aom_var_2d_u16_avx2(uint8_t *src,int src_stride,int width,int height)

{
  ushort uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  long lVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined1 (*pauVar10) [32];
  ulong uVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  long lVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [64];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [64];
  undefined1 auVar22 [32];
  undefined1 auVar23 [64];
  __m256i vsrc [8];
  undefined8 local_140 [36];
  
  lVar12 = (long)src * 2;
  if (width < 0x10) {
    auVar18 = ZEXT1664((undefined1  [16])0x0);
    uVar11 = 0;
  }
  else {
    lVar6 = (long)src_stride * 2;
    auVar18 = ZEXT1664((undefined1  [16])0x0);
    uVar11 = 0;
    do {
      auVar17 = auVar18._0_16_;
      pauVar10 = (undefined1 (*) [32])(lVar12 + uVar11 * 2);
      auVar19 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
      if (height < 9) {
        iVar13 = 0;
      }
      else {
        iVar15 = 0;
        do {
          lVar16 = 0;
          do {
            uVar7 = *(undefined8 *)(*pauVar10 + 8);
            uVar8 = *(undefined8 *)(*pauVar10 + 0x10);
            uVar9 = *(undefined8 *)(*pauVar10 + 0x18);
            *(undefined8 *)((long)local_140 + lVar16) = *(undefined8 *)*pauVar10;
            *(undefined8 *)((long)local_140 + lVar16 + 8) = uVar7;
            *(undefined8 *)((long)local_140 + lVar16 + 0x10) = uVar8;
            *(undefined8 *)((long)local_140 + lVar16 + 0x18) = uVar9;
            lVar16 = lVar16 + 0x20;
            pauVar10 = (undefined1 (*) [32])(*pauVar10 + lVar6);
          } while (lVar16 != 0x100);
          auVar23 = ZEXT1664((undefined1  [16])0x0);
          lVar16 = 0;
          auVar21 = ZEXT1664((undefined1  [16])0x0);
          do {
            auVar22 = *(undefined1 (*) [32])((long)local_140 + lVar16);
            auVar20 = vpunpcklwd_avx2(auVar22,auVar19);
            auVar20 = vpaddd_avx2(auVar23._0_32_,auVar20);
            auVar5 = vpunpckhwd_avx2(auVar22,auVar19);
            auVar20 = vpaddd_avx2(auVar20,auVar5);
            auVar23 = ZEXT3264(auVar20);
            auVar22 = vpmaddwd_avx2(auVar22,auVar22);
            auVar22 = vpaddd_avx2(auVar22,auVar21._0_32_);
            auVar21 = ZEXT3264(auVar22);
            lVar16 = lVar16 + 0x20;
          } while (lVar16 != 0x100);
          auVar17 = vpaddd_avx(auVar20._16_16_,auVar20._0_16_);
          auVar2 = vpshufd_avx(auVar17,0xee);
          auVar17 = vpaddd_avx(auVar17,auVar2);
          auVar2 = vpaddd_avx(auVar22._16_16_,auVar22._0_16_);
          auVar3 = vpshufd_avx(auVar2,0xee);
          auVar2 = vpaddd_avx(auVar2,auVar3);
          auVar17 = vphaddd_avx(auVar2,auVar17);
          auVar17 = vpshufd_avx(auVar17,0xe8);
          auVar17 = vpmovsxdq_avx(auVar17);
          auVar17 = vpaddq_avx(auVar18._0_16_,auVar17);
          auVar18 = ZEXT1664(auVar17);
          iVar15 = iVar15 + 8;
          iVar13 = (height - 9U & 0xfffffff8) + 8;
        } while (iVar15 < height + -8);
      }
      auVar18 = ZEXT1664((undefined1  [16])0x0);
      auVar20 = auVar18._0_32_;
      auVar21 = ZEXT1664((undefined1  [16])0x0);
      auVar22 = auVar21._0_32_;
      iVar15 = height - iVar13;
      if (iVar15 != 0 && iVar13 <= height) {
        do {
          auVar20 = *pauVar10;
          auVar22 = vpunpcklwd_avx2(auVar20,auVar19);
          auVar22 = vpaddd_avx2(auVar21._0_32_,auVar22);
          auVar5 = vpunpckhwd_avx2(auVar20,auVar19);
          auVar22 = vpaddd_avx2(auVar22,auVar5);
          auVar21 = ZEXT3264(auVar22);
          auVar20 = vpmaddwd_avx2(auVar20,auVar20);
          auVar20 = vpaddd_avx2(auVar20,auVar18._0_32_);
          auVar18 = ZEXT3264(auVar20);
          pauVar10 = (undefined1 (*) [32])(*pauVar10 + lVar6);
          iVar15 = iVar15 + -1;
        } while (iVar15 != 0);
      }
      auVar2 = vpaddd_avx(auVar22._16_16_,auVar22._0_16_);
      auVar3 = vpshufd_avx(auVar2,0xee);
      auVar2 = vpaddd_avx(auVar2,auVar3);
      auVar3 = vpaddd_avx(auVar20._16_16_,auVar20._0_16_);
      auVar4 = vpshufd_avx(auVar3,0xee);
      auVar3 = vpaddd_avx(auVar3,auVar4);
      auVar2 = vphaddd_avx(auVar3,auVar2);
      auVar2 = vpshufd_avx(auVar2,0xe8);
      auVar2 = vpmovsxdq_avx(auVar2);
      auVar17 = vpaddq_avx(auVar17,auVar2);
      auVar18 = ZEXT1664(auVar17);
      uVar11 = uVar11 + 0x10;
    } while ((long)uVar11 < (long)(width + -0xf));
  }
  auVar17 = auVar18._0_16_;
  if (0 < height) {
    iVar13 = 0;
    do {
      uVar14 = uVar11 & 0xffffffff;
      if ((int)uVar11 < width) {
        do {
          uVar1 = *(ushort *)(lVar12 + uVar14 * 2);
          auVar17 = vpunpcklqdq_avx(ZEXT416((uint)uVar1 * (uint)uVar1),ZEXT416((uint)uVar1));
          auVar17 = vpaddq_avx(auVar18._0_16_,auVar17);
          auVar18 = ZEXT1664(auVar17);
          uVar14 = uVar14 + 1;
        } while ((uint)width != uVar14);
      }
      auVar17 = auVar18._0_16_;
      iVar13 = iVar13 + 1;
      lVar12 = lVar12 + (long)src_stride * 2;
    } while (iVar13 != height);
  }
  lVar12 = vpextrq_avx(auVar17,1);
  return auVar17._0_8_ - (ulong)(lVar12 * lVar12) / (ulong)(long)(height * width);
}

Assistant:

uint64_t aom_var_2d_u16_avx2(uint8_t *src, int src_stride, int width,
                             int height) {
  uint16_t *srcp1 = CONVERT_TO_SHORTPTR(src), *srcp;
  uint64_t s = 0, ss = 0;
  __m256i vzero = _mm256_setzero_si256();
  __m256i v_acc_sum = vzero;
  __m256i v_acc_sqs = vzero;
  int i, j;

  // Process 16 elements in a row
  for (i = 0; i < width - 15; i += 16) {
    srcp = srcp1 + i;
    // Process 8 columns at a time
    for (j = 0; j < height - 8; j += 8) {
      __m256i vsrc[8];
      for (int k = 0; k < 8; k++) {
        vsrc[k] = _mm256_loadu_si256((__m256i *)srcp);
        srcp += src_stride;
      }
      for (int k = 0; k < 8; k++) {
        __m256i vsrc0 = _mm256_unpacklo_epi16(vsrc[k], vzero);
        __m256i vsrc1 = _mm256_unpackhi_epi16(vsrc[k], vzero);
        v_acc_sum = _mm256_add_epi32(vsrc0, v_acc_sum);
        v_acc_sum = _mm256_add_epi32(vsrc1, v_acc_sum);

        __m256i vsqs0 = _mm256_madd_epi16(vsrc[k], vsrc[k]);
        v_acc_sqs = _mm256_add_epi32(v_acc_sqs, vsqs0);
      }

      // Update total sum and clear the vectors
      s += mm256_accumulate_epi32(v_acc_sum);
      ss += mm256_accumulate_epi32(v_acc_sqs);
      v_acc_sum = vzero;
      v_acc_sqs = vzero;
    }

    // Process remaining rows (height not a multiple of 8)
    for (; j < height; j++) {
      __m256i vsrc = _mm256_loadu_si256((__m256i *)srcp);
      __m256i vsrc0 = _mm256_unpacklo_epi16(vsrc, vzero);
      __m256i vsrc1 = _mm256_unpackhi_epi16(vsrc, vzero);
      v_acc_sum = _mm256_add_epi32(vsrc0, v_acc_sum);
      v_acc_sum = _mm256_add_epi32(vsrc1, v_acc_sum);

      __m256i vsqs0 = _mm256_madd_epi16(vsrc, vsrc);
      v_acc_sqs = _mm256_add_epi32(v_acc_sqs, vsqs0);
      srcp += src_stride;
    }

    // Update total sum and clear the vectors
    s += mm256_accumulate_epi32(v_acc_sum);
    ss += mm256_accumulate_epi32(v_acc_sqs);
    v_acc_sum = vzero;
    v_acc_sqs = vzero;
  }

  // Process the remaining area using C
  srcp = srcp1;
  for (int k = 0; k < height; k++) {
    for (int m = i; m < width; m++) {
      uint16_t val = srcp[m];
      s += val;
      ss += val * val;
    }
    srcp += src_stride;
  }
  return (ss - s * s / (width * height));
}